

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-fast-dtoa.cpp
# Opt level: O0

bool __thiscall
icu_63::double_conversion::FastDtoa
          (double_conversion *this,double v,FastDtoaMode mode,int requested_digits,
          Vector<char> buffer,int *length,int *decimal_point)

{
  char *pcVar1;
  undefined4 in_register_00000014;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  int local_40;
  bool local_39;
  int decimal_exponent;
  bool result;
  int *decimal_point_local;
  int *length_local;
  int requested_digits_local;
  FastDtoaMode mode_local;
  double v_local;
  Vector<char> buffer_local;
  
  v_local = (double)CONCAT44(in_register_00000014,requested_digits);
  decimal_point_local = buffer._8_8_;
  buffer_local.start_._0_4_ = (uint)buffer.start_;
  length_local._4_4_ = (uint)this;
  local_39 = false;
  local_40 = 0;
  _decimal_exponent = length;
  length_local._0_4_ = mode;
  _requested_digits_local = v;
  if (length_local._4_4_ < 2) {
    buffer_00._8_8_ = decimal_point_local;
    buffer_00.start_ = (char *)(ulong)(uint)buffer_local.start_;
    local_39 = Grisu3((double_conversion *)((ulong)this & 0xffffffff),v,requested_digits,buffer_00,
                      &local_40,length);
  }
  else {
    if (length_local._4_4_ != 2) {
      abort();
    }
    buffer_01._8_8_ = decimal_point_local;
    buffer_01.start_ = (char *)(ulong)(uint)buffer_local.start_;
    local_39 = Grisu3Counted((double_conversion *)(ulong)mode,v,requested_digits,buffer_01,&local_40
                             ,length);
  }
  if (local_39 != false) {
    *_decimal_exponent = *decimal_point_local + local_40;
    pcVar1 = Vector<char>::operator[]((Vector<char> *)&v_local,*decimal_point_local);
    *pcVar1 = '\0';
  }
  return (bool)(local_39 & 1);
}

Assistant:

bool FastDtoa(double v,
              FastDtoaMode mode,
              int requested_digits,
              Vector<char> buffer,
              int* length,
              int* decimal_point) {
  ASSERT(v > 0);
  ASSERT(!Double(v).IsSpecial());

  bool result = false;
  int decimal_exponent = 0;
  switch (mode) {
    case FAST_DTOA_SHORTEST:
    case FAST_DTOA_SHORTEST_SINGLE:
      result = Grisu3(v, mode, buffer, length, &decimal_exponent);
      break;
    case FAST_DTOA_PRECISION:
      result = Grisu3Counted(v, requested_digits,
                             buffer, length, &decimal_exponent);
      break;
    default:
      UNREACHABLE();
  }
  if (result) {
    *decimal_point = *length + decimal_exponent;
    buffer[*length] = '\0';
  }
  return result;
}